

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffphpr(fitsfile *fptr,int simple,int bitpix,int naxis,long *naxes,LONGLONG pcount,
          LONGLONG gcount,int extend,int *status)

{
  ulong uVar1;
  LONGLONG naxesll [20];
  
  for (uVar1 = 0; ((long)uVar1 < (long)naxis && (uVar1 < 0x14)); uVar1 = uVar1 + 1) {
    naxesll[uVar1] = naxes[uVar1];
  }
  ffphprll(fptr,simple,bitpix,naxis,naxesll,pcount,gcount,extend,status);
  return *status;
}

Assistant:

int ffphpr( fitsfile *fptr, /* I - FITS file pointer                        */
            int simple,     /* I - does file conform to FITS standard? 1/0  */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            long naxes[],   /* I - length of each data axis                 */
            LONGLONG pcount, /* I - number of group parameters (usually 0)   */
            LONGLONG gcount, /* I - number of random groups (usually 1 or 0) */
            int extend,     /* I - may FITS file have extensions?           */
            int *status)    /* IO - error status                            */
/*
  write required primary header keywords
*/
{
    int ii;
    LONGLONG naxesll[20];
   
    for (ii = 0; (ii < naxis) && (ii < 20); ii++)
       naxesll[ii] = naxes[ii];

    ffphprll(fptr, simple, bitpix, naxis, naxesll, pcount, gcount,
             extend, status);

    return(*status);
}